

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constants.cpp
# Opt level: O1

Pointer __thiscall
dg::pta::LLVMPointerGraphBuilder::handleConstantGep
          (LLVMPointerGraphBuilder *this,GetElementPtrInst *GEP)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  uint uVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  PSNode *pPVar7;
  APInt *pAVar8;
  raw_ostream *prVar9;
  byte bVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  anon_union_8_2_1313ab2f_for_U aVar14;
  Offset OVar15;
  Pointer PVar16;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  APInt offset;
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  
  pPVar7 = getOperand(this,*(Value **)(GEP + -(ulong)(uint)(*(int *)(GEP + 0x14) << 5)));
  p_Var1 = (pPVar7->pointsTo).pointers._bits.
           super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
           .
           super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ._M_h._M_before_begin._M_nxt;
  if (((pPVar7->pointsTo).pointers._bits.
       super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
       .
       super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ._M_h._M_element_count == 0) || (p_Var2 = p_Var1[2]._M_nxt, ((ulong)p_Var2 & 1) != 0)) {
    lVar12 = 0;
  }
  else {
    lVar12 = 0;
    do {
      if (lVar12 == 0x3f) {
        lVar12 = 0x40;
        break;
      }
      bVar10 = (byte)lVar12;
      lVar12 = lVar12 + 1;
    } while (((ulong)p_Var2 >> (bVar10 & 0x3f) & 2) == 0);
  }
  lVar13 = lVar12 * 0x10 + _setEntry;
  lVar12 = (long)p_Var1[1]._M_nxt * 0x10;
  pPVar7 = *(PSNode **)(lVar12 + -0x10 + lVar13);
  OVar15.offset = *(uint64_t *)(lVar12 + -8 + lVar13);
  uVar5 = llvm::Module::getDataLayout();
  lVar12 = llvm::DataLayout::getPointerAlignElem(uVar5);
  uVar5 = *(uint *)(lVar12 + 4);
  llvm::APInt::APInt((APInt *)&local_40,uVar5,0,false);
  pAVar8 = (APInt *)llvm::Module::getDataLayout();
  cVar4 = llvm::GetElementPtrInst::accumulateConstantOffset((DataLayout *)GEP,pAVar8);
  uVar3 = local_38;
  if (cVar4 != '\0') {
    if (local_38 < 0x41) {
      if ((anon_union_8_2_1313ab2f_for_U *)local_40.VAL == (anon_union_8_2_1313ab2f_for_U *)0x0) {
        uVar11 = 0x40;
      }
      else {
        lVar12 = 0x3f;
        if ((anon_union_8_2_1313ab2f_for_U *)local_40.VAL != (anon_union_8_2_1313ab2f_for_U *)0x0) {
          for (; local_40.VAL >> lVar12 == 0; lVar12 = lVar12 + -1) {
          }
        }
        uVar11 = (uint)lVar12 ^ 0x3f;
      }
      iVar6 = (local_38 - 0x40) + uVar11;
    }
    else {
      iVar6 = llvm::APInt::countLeadingZerosSlowCase();
    }
    if ((uVar5 < uVar3 - iVar6) || (OVar15.offset == Offset::UNKNOWN)) {
      prVar9 = (raw_ostream *)llvm::errs();
      Str.Length = 0x1a;
      Str.Data = "WARN: Offset greater than ";
      prVar9 = llvm::raw_ostream::operator<<(prVar9,Str);
      prVar9 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar9,(ulong)uVar5);
      Str_00.Length = 4;
      Str_00.Data = "-bit";
      prVar9 = llvm::raw_ostream::operator<<(prVar9,Str_00);
      llvm::Value::print((raw_ostream *)GEP,SUB81(prVar9,0));
      Str_01.Length = 1;
      Str_01.Data = "\n";
      llvm::raw_ostream::operator<<(prVar9,Str_01);
    }
    else {
      aVar14.pVal = (uint64_t *)&local_40;
      if (0x40 < uVar3) {
        aVar14 = local_40;
      }
      OVar15.offset = *aVar14.pVal;
    }
  }
  if ((0x40 < local_38) &&
     ((anon_union_8_2_1313ab2f_for_U *)local_40.VAL != (anon_union_8_2_1313ab2f_for_U *)0x0)) {
    operator_delete__(local_40.pVal);
  }
  PVar16.offset.offset = OVar15.offset;
  PVar16.target = pPVar7;
  return PVar16;
}

Assistant:

Pointer
LLVMPointerGraphBuilder::handleConstantGep(const llvm::GetElementPtrInst *GEP) {
    using namespace llvm;

    const Value *op = GEP->getPointerOperand();
    Pointer pointer(UNKNOWN_MEMORY, Offset::UNKNOWN);

    // get operand PSNode (this may result in recursive call,
    // if this gep is recursively defined)
    PSNode *opNode = getOperand(op);
    assert(opNode->pointsTo.size() == 1 &&
           "Constant node has more that 1 pointer");
    pointer = *(opNode->pointsTo.begin());

    unsigned bitwidth = llvmutils::getPointerBitwidth(&M->getDataLayout(), op);
    APInt offset(bitwidth, 0);

    // get offset of this GEP
    if (GEP->accumulateConstantOffset(M->getDataLayout(), offset)) {
        if (offset.isIntN(bitwidth) && !pointer.offset.isUnknown())
            pointer.offset = offset.getZExtValue();
        else
            errs() << "WARN: Offset greater than " << bitwidth << "-bit" << *GEP
                   << "\n";
    }

    return pointer;
}